

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O0

char16 utf8::DecodeTail(char16 c1,LPCUTF8 *ptr,LPCUTF8 end,DecodeOptions *options,
                       bool *chunkEndsAtTruncatedSequence)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  char16 cVar5;
  DecodeOptions DVar6;
  BOOL BVar7;
  DecodeOptions DVar8;
  size_t sVar9;
  char16 local_32;
  BYTE c4;
  BYTE c3;
  BYTE c2;
  char16 ch;
  bool *chunkEndsAtTruncatedSequence_local;
  DecodeOptions *options_local;
  LPCUTF8 end_local;
  LPCUTF8 *ptr_local;
  char16 c1_local;
  
  local_32 = L'\0';
  sVar9 = EncodedBytes(c1);
  switch(sVar9) {
  case 1:
    if ((ushort)c1 < 0x80) {
      return c1;
    }
    DVar6 = operator&(*options,doSecondSurrogatePair);
    if (DVar6 == doDefault) {
      cVar5 = GetUnknownCharacter(*options);
      return cVar5;
    }
    *ptr = *ptr + -1;
    ptr_local._4_2_ = (char16)(*ptr)[-1];
    goto LAB_008d51db;
  case 2:
    if (end <= *ptr) {
      DVar6 = operator&(*options,doChunkedEncoding);
      if ((DVar6 != doDefault) && (*ptr = *ptr + -1, chunkEndsAtTruncatedSequence != (bool *)0x0)) {
        *chunkEndsAtTruncatedSequence = true;
      }
      cVar5 = GetUnknownCharacter(*options);
      return cVar5;
    }
    pbVar4 = *ptr;
    *ptr = pbVar4 + 1;
    bVar1 = *pbVar4;
    BVar7 = InRange(c1,L'Â',L'ß');
    if ((BVar7 == 0) || (BVar7 = InRange((ushort)bVar1,L'\x80',L'¿'), BVar7 == 0)) {
      *ptr = *ptr + -1;
      local_32 = GetUnknownCharacter(*options);
    }
    else {
      local_32 = (c1 & 0x1fU) << 6 | bVar1 & 0x3f;
      BVar7 = IsValidWideChar(local_32);
      if ((BVar7 == 0) && (DVar6 = operator&(*options,doAllowInvalidWCHARs), DVar6 == doDefault)) {
        local_32 = GetUnknownCharacter(*options);
      }
    }
    break;
  case 3:
    if (end <= *ptr + 1) {
      DVar6 = operator&(*options,doChunkedEncoding);
      if ((DVar6 != doDefault) && (*ptr = *ptr + -1, chunkEndsAtTruncatedSequence != (bool *)0x0)) {
        *chunkEndsAtTruncatedSequence = true;
      }
      cVar5 = GetUnknownCharacter(*options);
      return cVar5;
    }
    bVar1 = **ptr;
    bVar2 = (*ptr)[1];
    if (((((((c1 == L'à') && (BVar7 = InRange((ushort)bVar1,L'\xa0',L'¿'), BVar7 != 0)) &&
           (BVar7 = InRange((ushort)bVar2,L'\x80',L'¿'), BVar7 != 0)) ||
          (((BVar7 = InRange(c1,L'á',L'ì'), BVar7 != 0 &&
            (BVar7 = InRange((ushort)bVar1,L'\x80',L'¿'), BVar7 != 0)) &&
           (BVar7 = InRange((ushort)bVar2,L'\x80',L'¿'), BVar7 != 0)))) ||
         (((c1 == L'í' && (BVar7 = InRange((ushort)bVar1,L'\x80',L'\x9f'), BVar7 != 0)) &&
          (BVar7 = InRange((ushort)bVar2,L'\x80',L'¿'), BVar7 != 0)))) ||
        (((BVar7 = InRange(c1,L'î',L'ï'), BVar7 != 0 &&
          (BVar7 = InRange((ushort)bVar1,L'\x80',L'¿'), BVar7 != 0)) &&
         (BVar7 = InRange((ushort)bVar2,L'\x80',L'¿'), BVar7 != 0)))) ||
       (((DVar6 = operator&(*options,doAllowThreeByteSurrogates), DVar6 != doDefault &&
         (c1 == L'í')) &&
        ((BVar7 = InRange((ushort)bVar1,L'\x80',L'¿'), BVar7 != 0 &&
         (BVar7 = InRange((ushort)bVar2,L'\x80',L'¿'), BVar7 != 0)))))) {
      local_32 = c1 << 0xc | (bVar1 & 0x3f) << 6 | bVar2 & 0x3f;
      BVar7 = IsValidWideChar(local_32);
      if (BVar7 == 0) {
        DVar6 = *options;
        DVar8 = operator|(doAllowThreeByteSurrogates,doAllowInvalidWCHARs);
        DVar6 = operator&(DVar6,DVar8);
        if (DVar6 == doDefault) {
          local_32 = GetUnknownCharacter(*options);
        }
      }
      *ptr = *ptr + 2;
    }
    else {
      local_32 = GetUnknownCharacter(*options);
    }
    break;
  case 4:
    ptr_local._4_2_ = c1;
LAB_008d51db:
    if (*ptr + 2 < end) {
      bVar1 = **ptr;
      bVar2 = (*ptr)[1];
      bVar3 = (*ptr)[2];
      if ((((((ptr_local._4_2_ == L'ð') &&
             (BVar7 = InRange((ushort)bVar1,L'\x90',L'¿'), BVar7 != 0)) &&
            (BVar7 = InRange((ushort)bVar2,L'\x80',L'¿'), BVar7 != 0)) &&
           (BVar7 = InRange((ushort)bVar3,L'\x80',L'¿'), BVar7 != 0)) ||
          (((BVar7 = InRange(ptr_local._4_2_,L'ñ',L'ó'), BVar7 != 0 &&
            (BVar7 = InRange((ushort)bVar1,L'\x80',L'¿'), BVar7 != 0)) &&
           ((BVar7 = InRange((ushort)bVar2,L'\x80',L'¿'), BVar7 != 0 &&
            (BVar7 = InRange((ushort)bVar3,L'\x80',L'¿'), BVar7 != 0)))))) ||
         (((ptr_local._4_2_ == L'ô' && (BVar7 = InRange((ushort)bVar1,L'\x80',L'\x8f'), BVar7 != 0)
           ) && ((BVar7 = InRange((ushort)bVar2,L'\x80',L'¿'), BVar7 != 0 &&
                 (BVar7 = InRange((ushort)bVar3,L'\x80',L'¿'), BVar7 != 0)))))) {
        DVar8 = doSecondSurrogatePair;
        DVar6 = operator&(*options,doSecondSurrogatePair);
        if (DVar6 == doDefault) {
          local_32 = ((((ptr_local._4_2_ & 7U) << 2 | (ushort)((int)(bVar1 & 0x30) >> 4)) - 1U) *
                      0x40 | (bVar1 & 0xf) << 2 | (ushort)((int)(bVar2 & 0x30) >> 4)) + L'\xd800';
          DVar6 = operator|(*options,doSecondSurrogatePair);
          *options = DVar6;
        }
        else {
          local_32 = ((bVar2 & 0xf) << 6 | bVar3 & 0x3f) + L'\xdc00';
          DVar6 = *options;
          DVar8 = operator~((utf8 *)&DAT_00000004,DVar8);
          DVar6 = operator&(DVar6,DVar8);
          *options = DVar6;
          *ptr = *ptr + 3;
        }
      }
      else {
        local_32 = GetUnknownCharacter(*options);
      }
    }
    else {
      DVar6 = operator&(*options,doChunkedEncoding);
      if ((DVar6 != doDefault) && (*ptr = *ptr + -1, chunkEndsAtTruncatedSequence != (bool *)0x0)) {
        *chunkEndsAtTruncatedSequence = true;
      }
      local_32 = GetUnknownCharacter(*options);
    }
  }
  return local_32;
}

Assistant:

inline char16 DecodeTail(char16 c1, LPCUTF8& ptr, LPCUTF8 end, DecodeOptions& options, bool *chunkEndsAtTruncatedSequence)
    {
        char16 ch = 0;
        BYTE c2, c3, c4;

        switch (EncodedBytes(c1))
        {
        case 1:
            if (c1 < 0x80) return c1;

            if ((options & doSecondSurrogatePair) != 0)
            {
                // We're in the middle of decoding a surrogate pair from a four-byte utf8 sequence.
                // The high word has already been returned, but without advancing ptr, which was on byte 1.
                // ptr was then advanced externally when reading c1, which is byte 1, so ptr is now on byte 2.
                // byte 1 must have been a continuation byte, hence will be in case 1.
                ptr--; // back to byte 1
                c1 = ptr[-1]; // the original first byte

                // ptr is now on c2. We must also have c3 and c4, otherwise doSecondSurrogatePair won't set.
                _Analysis_assume_(ptr + 2 < end);
                goto LFourByte;
            }

            // 10xxxxxx (trail byte appearing in a lead byte position
            return GetUnknownCharacter(options);

        case 2:
            // Look for an overlong utf-8 sequence.
            if (ptr >= end)
            {
                if ((options & doChunkedEncoding) != 0)
                {
                    // The is a sequence that spans a chunk, push ptr back to the beginning of the sequence.
                    ptr--;

                    if (chunkEndsAtTruncatedSequence)
                    {
                        *chunkEndsAtTruncatedSequence = true;
                    }
                }
                return GetUnknownCharacter(options);
            }
            c2 = *ptr++;
            // 110XXXXx 10xxxxxx
            //      UTF16       |   UTF8 1st byte  2nd byte
            // U+0080..U+07FF   |    C2..DF         80..BF
            if (
                    InRange(c1, 0xC2, 0xDF)
                    && InRange(c2, 0x80, 0xBF)
                )
            {
                ch |= WCHAR(c1 & 0x1f) << 6;     // 0x0080 - 0x07ff
                ch |= WCHAR(c2 & 0x3f);
                if (!IsValidWideChar(ch) && ((options & doAllowInvalidWCHARs) == 0))
                {
                    ch = GetUnknownCharacter(options);
                }
            }
            else
            {
                ptr--;
                ch = GetUnknownCharacter(options);
            }
            break;

        case 3:
            // 1110XXXX 10Xxxxxx 10xxxxxx
            // Look for overlong utf-8 sequence.
            if (ptr + 1 >= end)
            {
                if ((options & doChunkedEncoding) != 0)
                {
                    // The is a sequence that spans a chunk, push ptr back to the beginning of the sequence.
                    ptr--;

                    if (chunkEndsAtTruncatedSequence)
                    {
                        *chunkEndsAtTruncatedSequence = true;
                    }
                }

                return GetUnknownCharacter(options);
            }

            //      UTF16       |   UTF8 1st byte  2nd byte 3rd byte
            // U+0800..U+0FFF   |    E0             A0..BF   80..BF
            // U+1000..U+CFFF   |    E1..EC         80..BF   80..BF
            // U+D000..U+D7FF   |    ED             80..9F   80..BF
            // U+E000..U+FFFF   |    EE..EF         80..BF   80..BF
            c2 = ptr[0];
            c3 = ptr[1];
            if (
                // any following be true
                    (c1 == 0xE0
                    && InRange(c2, 0xA0, 0xBF)
                    && InRange(c3, 0x80, 0xBF))
                    ||
                    (InRange(c1, 0xE1, 0xEC)
                    && InRange(c2, 0x80, 0xBF)
                    && InRange(c3, 0x80, 0xBF))
                    ||
                    (c1 == 0xED
                    && InRange(c2, 0x80, 0x9F)
                    && InRange(c3, 0x80, 0xBF))
                    ||
                    (InRange(c1, 0xEE, 0xEF)
                    && InRange(c2, 0x80, 0xBF)
                    && InRange(c3, 0x80, 0xBF))
                    ||
                    (((options & doAllowThreeByteSurrogates) != 0)
                    &&
                    c1 == 0xED
                    && InRange(c2, 0x80, 0xBF)
                    && InRange(c3, 0x80, 0xBF)
                    )
                )
            {
                ch  = WCHAR(c1 & 0x0f) << 12;    // 0x0800 - 0xffff
                ch |= WCHAR(c2 & 0x3f) << 6;     // 0x0080 - 0x07ff
                ch |= WCHAR(c3 & 0x3f);
                if (!IsValidWideChar(ch) && ((options & (doAllowThreeByteSurrogates | doAllowInvalidWCHARs)) == 0))
                {
                    ch = GetUnknownCharacter(options);
                }
                ptr += 2;
            }
            else
            {
                ch = GetUnknownCharacter(options);
                // Windows OS 1713952. Only drop the illegal leading byte
                // Retry next byte.
                // ptr is already advanced.
            }
            break;

        case 4:
LFourByte:
            // 11110XXX 10XXxxxx 10xxxxxx 10xxxxxx or 11111xxx ....
            // NOTE: 11111xxx is not supported
            if (ptr + 2 >= end)
            {
                if ((options & doChunkedEncoding) != 0)
                {
                    // The is a sequence that spans a chunk, push ptr back to the beginning of the sequence.
                    ptr--;

                    if (chunkEndsAtTruncatedSequence)
                    {
                        *chunkEndsAtTruncatedSequence = true;
                    }
                }

                ch = GetUnknownCharacter(options);
                break;
            }

            c2 = ptr[0];
            c3 = ptr[1];
            c4 = ptr[2];

            //      UTF16         |   UTF8 1st byte  2nd byte 3rd byte 4th byte
            // U+10000..U+3FFFF   |    F0             90..BF   80..BF   80..BF
            // U+40000..U+FFFFF   |    F1..F3         80..BF   80..BF   80..BF
            // U+100000..U+10FFFF |    F4             80..8F   80..BF   80..BF
            if (! // NOT Unicode well-formed byte sequences
                    (
                    // any following be true
                        (c1 == 0xF0
                        && InRange(c2, 0x90,0xBF)
                        && InRange(c3, 0x80,0xBF)
                        && InRange(c4, 0x80,0xBF))
                    ||
                        (InRange(c1, 0xF1, 0xF3)
                        && InRange(c2, 0x80,0xBF)
                        && InRange(c3, 0x80,0xBF)
                        && InRange(c4, 0x80,0xBF))
                    ||
                        (c1 == 0xF4
                        && InRange(c2, 0x80,0x8F)
                        && InRange(c3, 0x80,0xBF)
                        && InRange(c4, 0x80,0xBF))
                    )
                )
            {
                // Windows OS 1713952. Only drop the illegal leading byte.
                // Retry next byte.
                // ptr is already advanced 1.
                ch = GetUnknownCharacter(options);
                break;
            }

            if ((options & doSecondSurrogatePair) == 0)
            {
                // Decode high 10 bits of utf-8 20 bit char
                ch  = WCHAR(c1 & 0x07) << 2;
                ch |= WCHAR(c2 & 0x30) >> 4;
                ch  = (ch - 1) << 6;             // ch == 0000 00ww ww00 0000
                ch |= WCHAR(c2 & 0x0f) << 2;     // ch == 0000 00ww wwzz zz00
                ch |= WCHAR(c3 & 0x30) >> 4;     // ch == 0000 00ww wwzz zzyy
                // Encode first word of utf-16 surrogate pair
                ch += 0xD800;
                // Remember next call must return second word
                options = (DecodeOptions)(options | doSecondSurrogatePair);
                // Leave ptr on byte 1, this way:
                //  - callers who test that ptr has been advanced by utf8::Decode will see progress for
                //    both words of the surrogate pair.
                //  - callers who calculate the number of multi-unit chars by subtracting after from before ptr
                //    will accumulate 0 for first word and 2 for second, thus utf8 chars equals 2 utf16 chars + 2
                //    multi-unit chars, as it should be.
            }
            else
            {
                // Decode low 10 bits of utf-8 20 bit char
                ch = WCHAR(c3 & 0x0f) << 6;     // ch == 0000 00yy yy00 0000
                ch |= WCHAR(c4 & 0x3f);          // ch == 0000 00yy yyxx xxxx
                // Encode second word of utf-16 surrogate pair
                ch += 0xDC00;
                // We're done with this char
                options = (DecodeOptions)(options & ~doSecondSurrogatePair);
                ptr += 3; // remember, got here by subtracting one from ptr in case 1, so effective increment is 2
            }
            break;
        }

        return ch;
    }